

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O2

dgEdge * __thiscall
dgPolyhedra::FindEarTip
          (dgPolyhedra *this,dgEdge *face,HaF64 *pool,HaI32 stride,
          dgDownHeap<dgEdge_*,_double> *heap,dgBigVector *normal)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  HaF64 *pHVar12;
  dgEdge *pdVar13;
  dgEdge **ppdVar14;
  dgEdge *pdVar15;
  dgPolyhedra *this_00;
  dgHeapBase<dgEdge_*,_double> *this_01;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  dgBigVector d1;
  dgBigVector n;
  dgBigVector p2;
  dgBigVector p10;
  dgBigVector p;
  dgBigVector p02;
  dgBigVector p21;
  dgBigVector d0;
  dgBigVector p1;
  dgBigVector p0;
  dgEdge *local_1b8;
  dgHeapBase<dgEdge_*,_double> *local_1b0;
  dgTemplateVector<double> local_1a8;
  undefined1 local_188 [16];
  double dStack_178;
  double dStack_170;
  dgTemplateVector<double> local_168;
  HaF64 *local_140;
  dgPolyhedra *local_138;
  double local_130;
  undefined1 local_128 [16];
  double local_118;
  double local_110;
  ulong local_100;
  undefined1 local_f8 [16];
  double local_e8;
  double local_e0;
  undefined1 local_d8 [16];
  double local_c8;
  double local_c0;
  undefined1 local_b8 [16];
  double local_a8;
  double local_a0;
  dgBigVector local_98;
  dgTemplateVector<double> local_78;
  undefined1 local_58 [16];
  double local_48;
  
  lVar16 = (long)stride;
  local_1b8 = face;
  local_1b0 = &heap->super_dgHeapBase<dgEdge_*,_double>;
  local_138 = this;
  dgBigVector::dgBigVector((dgBigVector *)local_58,pool + face->m_prev->m_incidentVertex * lVar16);
  local_140 = pool;
  dgBigVector::dgBigVector((dgBigVector *)&local_78,pool + face->m_incidentVertex * lVar16);
  auVar26 = vsubpd_avx((undefined1  [16])local_78._0_16_,local_58);
  local_168.m_z = local_78.m_z - local_48;
  local_168.m_x = auVar26._0_8_;
  local_168.m_y = auVar26._8_8_;
  local_168.m_w = local_78.m_w;
  dgBigVector::dgBigVector(&local_98,&local_168);
  auVar3._8_8_ = local_98.super_dgTemplateVector<double>.m_y;
  auVar3._0_8_ = local_98.super_dgTemplateVector<double>.m_x;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_98.super_dgTemplateVector<double>.m_z;
  auVar26._0_8_ =
       local_98.super_dgTemplateVector<double>.m_x * local_98.super_dgTemplateVector<double>.m_x;
  auVar26._8_8_ =
       local_98.super_dgTemplateVector<double>.m_y * local_98.super_dgTemplateVector<double>.m_y;
  auVar26 = vshufpd_avx(auVar26,auVar26,1);
  auVar26 = vfmadd231sd_fma(auVar26,auVar3,auVar3);
  auVar26 = vfmadd231sd_fma(auVar26,auVar17,auVar17);
  auVar26 = vsqrtsd_avx(auVar26,auVar26);
  auVar26 = vmaxsd_avx(ZEXT816(0x3ddb7cdfe0000000),auVar26);
  local_1a8.m_y = 1.0 / auVar26._0_8_;
  local_1a8.m_z = local_98.super_dgTemplateVector<double>.m_z * local_1a8.m_y;
  local_1a8.m_x = local_98.super_dgTemplateVector<double>.m_x * local_1a8.m_y;
  local_1a8.m_y = local_98.super_dgTemplateVector<double>.m_y * local_1a8.m_y;
  local_1a8.m_w = local_98.super_dgTemplateVector<double>.m_w;
  dgBigVector::dgBigVector((dgBigVector *)&local_168,&local_1a8);
  auVar26 = ZEXT816(0x4024000000000000);
  local_98.super_dgTemplateVector<double>.m_x = local_168.m_x;
  local_98.super_dgTemplateVector<double>.m_y = local_168.m_y;
  local_98.super_dgTemplateVector<double>.m_z = local_168.m_z;
  local_98.super_dgTemplateVector<double>.m_w = local_168.m_w;
  pdVar13 = face;
  do {
    local_100 = auVar26._0_8_;
    dgBigVector::dgBigVector
              ((dgBigVector *)&local_168,local_140 + pdVar13->m_next->m_incidentVertex * lVar16);
    auVar8._8_8_ = local_168.m_y;
    auVar8._0_8_ = local_168.m_x;
    local_188 = vsubpd_avx(auVar8,(undefined1  [16])local_78._0_16_);
    dStack_178 = local_168.m_z - local_78.m_z;
    dStack_170 = local_168.m_w;
    dgBigVector::dgBigVector((dgBigVector *)&local_1a8,(dgTemplateVector<double> *)local_188);
    auVar4._8_8_ = local_1a8.m_y;
    auVar4._0_8_ = local_1a8.m_x;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_1a8.m_z;
    auVar35._0_8_ = local_1a8.m_x * local_1a8.m_x;
    auVar35._8_8_ = local_1a8.m_y * local_1a8.m_y;
    auVar26 = vshufpd_avx(auVar35,auVar35,1);
    auVar26 = vfmadd231sd_fma(auVar26,auVar4,auVar4);
    auVar26 = vfmadd231sd_fma(auVar26,auVar18,auVar18);
    auVar26 = vsqrtsd_avx(auVar26,auVar26);
    auVar36._0_4_ = (float)auVar26._0_8_;
    auVar36._4_12_ = auVar26._4_12_;
    auVar26 = vmaxss_avx(SUB6416(ZEXT464(0x2edbe6ff),0),auVar36);
    dVar34 = (double)(1.0 / auVar26._0_4_);
    local_118 = local_1a8.m_z * dVar34;
    local_128._8_8_ = local_1a8.m_y * dVar34;
    local_128._0_8_ = local_1a8.m_x * dVar34;
    local_110 = local_1a8.m_w;
    dgBigVector::dgBigVector((dgBigVector *)local_188,(dgTemplateVector<double> *)local_128);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = local_98.super_dgTemplateVector<double>.m_x;
    auVar40._8_8_ = local_98.super_dgTemplateVector<double>.m_z;
    auVar40._0_8_ = local_98.super_dgTemplateVector<double>.m_z;
    auVar11._8_8_ = local_98.super_dgTemplateVector<double>.m_z;
    auVar11._0_8_ = local_98.super_dgTemplateVector<double>.m_y;
    local_1a8.m_x = (double)local_188._0_8_;
    local_1a8.m_y = (double)local_188._8_8_;
    local_1a8.m_z = dStack_178;
    local_1a8.m_w = dStack_170;
    auVar26 = vunpcklpd_avx(auVar40,auVar27);
    auVar7._8_8_ = dStack_178;
    auVar7._0_8_ = local_188._8_8_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_188._0_8_;
    auVar43._8_8_ = dStack_178;
    auVar43._0_8_ = dStack_178;
    auVar3 = vunpcklpd_avx(auVar43,auVar19);
    auVar41._0_8_ = (double)local_188._8_8_ * auVar26._0_8_;
    auVar41._8_8_ = dStack_178 * auVar26._8_8_;
    local_128 = vfmsub213pd_fma(auVar3,auVar11,auVar41);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = (double)local_188._0_8_ * local_98.super_dgTemplateVector<double>.m_y;
    auVar26 = vfmsub231sd_fma(auVar20,auVar27,auVar7);
    local_118 = auVar26._0_8_;
    local_110 = local_98.super_dgTemplateVector<double>.m_w;
    dgBigVector::dgBigVector((dgBigVector *)local_188,(dgTemplateVector<double> *)local_128);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = (normal->super_dgTemplateVector<double>).m_x;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_188._0_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = (normal->super_dgTemplateVector<double>).m_y * (double)local_188._8_8_;
    auVar26 = vfmadd231sd_fma(auVar28,auVar21,auVar1);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (normal->super_dgTemplateVector<double>).m_z;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dStack_178;
    auVar23 = vfmadd132sd_fma(auVar22,auVar26,auVar2);
    dVar34 = auVar23._0_8_;
    if (0.0 <= dVar34) {
      local_130 = dVar34;
      dgDownHeap<dgEdge_*,_double>::Push
                ((dgDownHeap<dgEdge_*,_double> *)local_1b0,&local_1b8,dVar34);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_130;
    }
    local_98.super_dgTemplateVector<double>.m_x = local_1a8.m_x;
    local_98.super_dgTemplateVector<double>.m_y = local_1a8.m_y;
    local_98.super_dgTemplateVector<double>.m_z = local_1a8.m_z;
    local_98.super_dgTemplateVector<double>.m_w = local_1a8.m_w;
    local_78.m_y = local_168.m_y;
    local_78.m_x = local_168.m_x;
    local_78.m_z = local_168.m_z;
    local_78.m_w = local_168.m_w;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_100;
    auVar26 = vminsd_avx(auVar23,auVar29);
    pdVar13 = local_1b8->m_next;
    local_1b8 = pdVar13;
  } while (pdVar13 != face);
  if (auVar26._0_8_ <= 0.10000000149011612) {
    pdVar13 = (dgEdge *)0x0;
    this_00 = local_138;
    this_01 = local_1b0;
    while (this_01->m_curCount != 0) {
      ppdVar14 = dgHeapBase<dgEdge_*,_double>::operator[](this_01,0);
      pdVar13 = *ppdVar14;
      dgDownHeap<dgEdge_*,_double>::Pop((dgDownHeap<dgEdge_*,_double> *)this_01);
      pdVar15 = FindEdge(this_00,pdVar13->m_prev->m_incidentVertex,pdVar13->m_next->m_incidentVertex
                        );
      pHVar12 = local_140;
      if (pdVar15 == (dgEdge *)0x0) {
        dgBigVector::dgBigVector
                  ((dgBigVector *)&local_168,local_140 + pdVar13->m_prev->m_incidentVertex * lVar16)
        ;
        dgBigVector::dgBigVector
                  ((dgBigVector *)&local_1a8,pHVar12 + pdVar13->m_incidentVertex * lVar16);
        dgBigVector::dgBigVector
                  ((dgBigVector *)local_188,pHVar12 + pdVar13->m_next->m_incidentVertex * lVar16);
        auVar5._8_8_ = local_1a8.m_y;
        auVar5._0_8_ = local_1a8.m_x;
        auVar9._8_8_ = local_168.m_y;
        auVar9._0_8_ = local_168.m_x;
        local_b8 = vsubpd_avx(auVar5,auVar9);
        local_a8 = local_1a8.m_z - local_168.m_z;
        local_a0 = local_1a8.m_w;
        dgBigVector::dgBigVector((dgBigVector *)local_128,(dgTemplateVector<double> *)local_b8);
        auVar6._8_8_ = local_1a8.m_y;
        auVar6._0_8_ = local_1a8.m_x;
        local_d8 = vsubpd_avx(local_188,auVar6);
        local_c8 = dStack_178 - local_1a8.m_z;
        local_c0 = dStack_170;
        dgBigVector::dgBigVector((dgBigVector *)local_b8,(dgTemplateVector<double> *)local_d8);
        this_01 = local_1b0;
        auVar10._8_8_ = local_168.m_y;
        auVar10._0_8_ = local_168.m_x;
        local_f8 = vsubpd_avx(auVar10,local_188);
        local_e8 = local_168.m_z - dStack_178;
        local_e0 = local_168.m_w;
        dgBigVector::dgBigVector((dgBigVector *)local_d8,(dgTemplateVector<double> *)local_f8);
        ppdVar14 = &pdVar13->m_next;
        do {
          do {
            do {
              local_1b8 = (*ppdVar14)->m_next;
              if (local_1b8 == pdVar13->m_prev) {
                return pdVar13;
              }
              dgBigVector::dgBigVector
                        ((dgBigVector *)local_f8,local_140 + local_1b8->m_incidentVertex * lVar16);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = local_128._8_8_;
              auVar44._8_8_ = 0;
              auVar44._0_8_ = local_118;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = local_128._0_8_;
              auVar38._8_8_ = 0;
              auVar38._0_8_ = (double)local_f8._8_8_ - local_168.m_y;
              auVar59._8_8_ = 0;
              auVar59._0_8_ = (double)local_128._8_8_ * (local_e8 - local_168.m_z);
              auVar26 = vfmsub231sd_fma(auVar59,auVar38,auVar44);
              auVar42._8_8_ = 0;
              auVar42._0_8_ = local_e8 - local_168.m_z;
              auVar45._8_8_ = 0;
              auVar45._0_8_ = local_118 * ((double)local_f8._0_8_ - local_168.m_x);
              auVar3 = vfmsub231sd_fma(auVar45,auVar51,auVar42);
              dVar34 = (normal->super_dgTemplateVector<double>).m_y;
              auVar39._8_8_ = 0;
              auVar39._0_8_ = (normal->super_dgTemplateVector<double>).m_z;
              auVar24._8_8_ = 0;
              auVar24._0_8_ = (double)local_f8._0_8_ - local_168.m_x;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = (double)local_128._0_8_ * ((double)local_f8._8_8_ - local_168.m_y);
              auVar17 = vfmsub231sd_fma(auVar52,auVar24,auVar56);
              auVar25._8_8_ = 0;
              auVar25._0_8_ = (normal->super_dgTemplateVector<double>).m_x;
              auVar46._8_8_ = 0;
              auVar46._0_8_ = auVar3._0_8_ * dVar34;
              auVar26 = vfmadd231sd_fma(auVar46,auVar25,auVar26);
              auVar26 = vfmadd231sd_fma(auVar26,auVar39,auVar17);
              ppdVar14 = &local_1b8;
            } while (0.05000000074505806 <= auVar26._0_8_);
            auVar64._8_8_ = 0;
            auVar64._0_8_ = local_b8._8_8_;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = local_a8;
            auVar63._8_8_ = 0;
            auVar63._0_8_ = local_b8._0_8_;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = (double)local_f8._8_8_ - local_1a8.m_y;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = (double)local_b8._8_8_ * (local_e8 - local_1a8.m_z);
            auVar26 = vfmsub231sd_fma(auVar65,auVar53,auVar60);
            auVar57._8_8_ = 0;
            auVar57._0_8_ = local_e8 - local_1a8.m_z;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = local_a8 * ((double)local_f8._0_8_ - local_1a8.m_x);
            auVar3 = vfmsub231sd_fma(auVar61,auVar63,auVar57);
            auVar47._8_8_ = 0;
            auVar47._0_8_ = (double)local_f8._0_8_ - local_1a8.m_x;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = (double)local_b8._0_8_ * ((double)local_f8._8_8_ - local_1a8.m_y);
            auVar17 = vfmsub231sd_fma(auVar54,auVar47,auVar64);
            auVar48._8_8_ = 0;
            auVar48._0_8_ = auVar3._0_8_ * dVar34;
            auVar26 = vfmadd231sd_fma(auVar48,auVar25,auVar26);
            auVar26 = vfmadd231sd_fma(auVar26,auVar39,auVar17);
            ppdVar14 = &local_1b8;
          } while (0.05000000074505806 <= auVar26._0_8_);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = local_d8._8_8_;
          auVar49._8_8_ = 0;
          auVar49._0_8_ = local_c8;
          auVar55._8_8_ = 0;
          auVar55._0_8_ = local_d8._0_8_;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = (double)local_f8._8_8_ - (double)local_188._8_8_;
          auVar62._8_8_ = 0;
          auVar62._0_8_ = (double)local_d8._8_8_ * (local_e8 - dStack_178);
          auVar26 = vfmsub231sd_fma(auVar62,auVar32,auVar49);
          auVar37._8_8_ = 0;
          auVar37._0_8_ = local_e8 - dStack_178;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = local_c8 * ((double)local_f8._0_8_ - (double)local_188._0_8_);
          auVar3 = vfmsub231sd_fma(auVar50,auVar55,auVar37);
          auVar30._8_8_ = 0;
          auVar30._0_8_ = (double)local_f8._0_8_ - (double)local_188._0_8_;
          auVar33._8_8_ = 0;
          auVar33._0_8_ =
               (double)local_d8._0_8_ * ((double)local_f8._8_8_ - (double)local_188._8_8_);
          auVar17 = vfmsub231sd_fma(auVar33,auVar30,auVar58);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = dVar34 * auVar3._0_8_;
          auVar26 = vfmadd213sd_fma(auVar25,auVar26,auVar31);
          auVar26 = vfmadd213sd_fma(auVar39,auVar17,auVar26);
          ppdVar14 = &local_1b8;
        } while (0.05000000074505806 <= auVar26._0_8_);
        this_00 = local_138;
        if (local_1b8 == pdVar13->m_prev) {
          return pdVar13;
        }
      }
    }
  }
  else {
    ppdVar14 = dgHeapBase<dgEdge_*,_double>::operator[](local_1b0,0);
    pdVar13 = *ppdVar14;
  }
  return pdVar13;
}

Assistant:

dgEdge* dgPolyhedra::FindEarTip (dgEdge* const face, const hacd::HaF64* const pool, hacd::HaI32 stride, dgDownHeap<dgEdge*, hacd::HaF64>& heap, const dgBigVector &normal) const
{
	dgEdge* ptr = face;
	dgBigVector p0 (&pool[ptr->m_prev->m_incidentVertex * stride]);
	dgBigVector p1 (&pool[ptr->m_incidentVertex * stride]);
	dgBigVector d0 (p1 - p0);
	hacd::HaF64 f = sqrt (d0 % d0);
	if (f < hacd::HaF64 (1.0e-10f)) {
		f = hacd::HaF64 (1.0e-10f);
	}
	d0 = d0.Scale (hacd::HaF64 (1.0f) / f);

	hacd::HaF64 minAngle = hacd::HaF32 (10.0f);
	do {
		dgBigVector p2 (&pool [ptr->m_next->m_incidentVertex * stride]);
		dgBigVector d1 (p2 - p1);
		hacd::HaF32 f = dgSqrt (d1 % d1);
		if (f < hacd::HaF32 (1.0e-10f)) {
			f = hacd::HaF32 (1.0e-10f);
		}
		d1 = d1.Scale (hacd::HaF32 (1.0f) / f);
		dgBigVector n (d0 * d1);

		hacd::HaF64 angle = normal %  n;
		if (angle >= hacd::HaF64 (0.0f)) {
			heap.Push (ptr, angle);
		}

		if (angle < minAngle) {
			minAngle = angle;
		}

		d0 = d1;
		p1 = p2;
		ptr = ptr->m_next;
	} while (ptr != face);

	if (minAngle > hacd::HaF32 (0.1f)) {
		return heap[0];
	}

	dgEdge* ear = NULL;
	while (heap.GetCount()) {
		ear = heap[0];
		heap.Pop();

		if (FindEdge (ear->m_prev->m_incidentVertex, ear->m_next->m_incidentVertex)) {
			continue;
		}

		dgBigVector p0 (&pool [ear->m_prev->m_incidentVertex * stride]);
		dgBigVector p1 (&pool [ear->m_incidentVertex * stride]);
		dgBigVector p2 (&pool [ear->m_next->m_incidentVertex * stride]);

		dgBigVector p10 (p1 - p0);
		dgBigVector p21 (p2 - p1);
		dgBigVector p02 (p0 - p2);

		for (ptr = ear->m_next->m_next; ptr != ear->m_prev; ptr = ptr->m_next) {
			dgBigVector p (&pool [ptr->m_incidentVertex * stride]);

			hacd::HaF64 side = ((p - p0) * p10) % normal;
			if (side < hacd::HaF64 (0.05f)) {
				side = ((p - p1) * p21) % normal;
				if (side < hacd::HaF64 (0.05f)) {
					side = ((p - p2) * p02) % normal;
					if (side < hacd::HaF32 (0.05f)) {
						break;
					}
				}
			}
		}

		if (ptr == ear->m_prev) {
			break;
		}
	}

	return ear;
}